

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewRandomAccessFile
          (PosixEnv *this,string *filename,RandomAccessFile **result)

{
  bool bVar1;
  undefined1 uVar2;
  int __fd;
  char *pcVar3;
  void *pvVar4;
  undefined8 *in_RCX;
  string *in_RDX;
  PosixRandomAccessFile *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  void *mmap_base;
  int fd;
  Status *status;
  uint64_t file_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  Status *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  string *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff30;
  PosixMmapReadableFile *in_stack_ffffffffffffff38;
  Limiter *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_t local_50 [9];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RCX = 0;
  this_00 = in_RDI;
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (in_stack_ffffffffffffff08);
  __fd = open(pcVar3,0x80000);
  if (__fd < 0) {
    __errno_location();
    PosixError(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  }
  else {
    bVar1 = Limiter::Acquire(in_stack_ffffffffffffff40);
    if (bVar1) {
      (*(in_RSI->super_RandomAccessFile)._vptr_RandomAccessFile[0xb])(in_RDI,in_RSI,in_RDX,local_50)
      ;
      uVar2 = Status::ok((Status *)in_stack_ffffffffffffff08);
      if ((bool)uVar2) {
        pvVar4 = mmap((void *)0x0,local_50[0],1,1,__fd,0);
        if (pvVar4 == (void *)0xffffffffffffffff) {
          __errno_location();
          PosixError(in_RDX,in_stack_ffffffffffffff1c);
          Status::operator=((Status *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            in_stack_ffffffffffffff10);
          Status::~Status((Status *)in_stack_ffffffffffffff08);
        }
        else {
          pcVar3 = (char *)operator_new(0x40);
          std::__cxx11::string::string(this_00,in_RDI);
          PosixMmapReadableFile::PosixMmapReadableFile
                    (in_stack_ffffffffffffff38,(string *)CONCAT17(uVar2,in_stack_ffffffffffffff30),
                     pcVar3,(size_t)in_stack_ffffffffffffff20,
                     (Limiter *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          *in_RCX = pcVar3;
          std::__cxx11::string::~string(in_stack_ffffffffffffff08);
        }
      }
      close(__fd);
      bVar1 = Status::ok((Status *)in_stack_ffffffffffffff08);
      if (!bVar1) {
        Limiter::Release((Limiter *)in_stack_ffffffffffffff10);
      }
    }
    else {
      pvVar4 = operator_new(0x38);
      std::__cxx11::string::string(this_00,in_RDI);
      PosixRandomAccessFile::PosixRandomAccessFile
                (in_RSI,this_00,(int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff40);
      *in_RCX = pvVar4;
      std::__cxx11::string::~string(in_stack_ffffffffffffff08);
      Status::OK();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Status)(char *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

Status NewRandomAccessFile(const std::string& filename,
                             RandomAccessFile** result) override {
    *result = nullptr;
    int fd = ::open(filename.c_str(), O_RDONLY | kOpenBaseFlags);
    if (fd < 0) {
      return PosixError(filename, errno);
    }

    if (!mmap_limiter_.Acquire()) {
      *result = new PosixRandomAccessFile(filename, fd, &fd_limiter_);
      return Status::OK();
    }

    uint64_t file_size;
    Status status = GetFileSize(filename, &file_size);
    if (status.ok()) {
      void* mmap_base =
          ::mmap(/*addr=*/nullptr, file_size, PROT_READ, MAP_SHARED, fd, 0);
      if (mmap_base != MAP_FAILED) {
        *result = new PosixMmapReadableFile(filename,
                                            reinterpret_cast<char*>(mmap_base),
                                            file_size, &mmap_limiter_);
      } else {
        status = PosixError(filename, errno);
      }
    }
    ::close(fd);
    if (!status.ok()) {
      mmap_limiter_.Release();
    }
    return status;
  }